

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beast_Journal.cpp
# Opt level: O2

void __thiscall beast::Journal::ScopedStream::~ScopedStream(ScopedStream *this)

{
  Severity SVar1;
  Sink *pSVar2;
  bool bVar3;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [32];
  
  std::__cxx11::stringbuf::str();
  if (local_60._M_string_length != 0) {
    bVar3 = std::operator==(&local_60,"\n");
    pSVar2 = this->m_sink;
    SVar1 = this->m_level;
    if (bVar3) {
      std::__cxx11::string::string(local_40,"",&local_61);
      (*pSVar2->_vptr_Sink[7])(pSVar2,(ulong)SVar1,local_40);
      std::__cxx11::string::~string(local_40);
    }
    else {
      (*pSVar2->_vptr_Sink[7])(pSVar2,(ulong)SVar1,&local_60);
    }
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_ostream);
  return;
}

Assistant:

Journal::ScopedStream::~ScopedStream ()
{
    std::string const& s (m_ostream.str());
    if (! s.empty ())
    {
        if (s == "\n")
            m_sink.write (m_level, "");
        else
            m_sink.write (m_level, s);
    }
}